

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O3

int gray_conic_to(FT_Vector *control,FT_Vector *to,gray_PWorker worker)

{
  bool bVar1;
  undefined1 auVar2 [12];
  int iVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  byte bVar8;
  long lVar9;
  ulong uVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  undefined1 auVar22 [16];
  long lVar23;
  
  lVar21 = worker->y;
  lVar14 = to->x * 4;
  lVar23 = to->y * 4;
  iVar12 = worker->max_ey;
  iVar13 = (int)((ulong)lVar21 >> 8);
  iVar17 = (int)((ulong)control->y >> 6);
  iVar3 = (int)((ulong)to->y >> 6);
  if ((iVar3 < iVar12 || (iVar17 < iVar12 || iVar13 < iVar12)) &&
     (iVar12 = worker->min_ey, iVar12 <= iVar3 || (iVar12 <= iVar17 || iVar12 <= iVar13))) {
    lVar20 = worker->x;
    lVar6 = control->x * 4;
    lVar9 = control->y * 4;
    lVar15 = lVar6 - lVar20;
    lVar16 = lVar9 - lVar21;
    uVar18 = lVar14 - (lVar6 + lVar15);
    uVar19 = lVar23 - (lVar9 + lVar16);
    uVar7 = -uVar18;
    if (0 < (long)uVar18) {
      uVar7 = uVar18;
    }
    uVar10 = -uVar19;
    if (0 < (long)uVar19) {
      uVar10 = uVar19;
    }
    if (uVar10 < uVar7) {
      uVar10 = uVar7;
    }
    if (uVar10 < 0x41) {
      gray_render_line(worker,lVar14,lVar23);
    }
    else {
      iVar12 = -0x21;
      uVar5 = 0x20;
      do {
        uVar4 = uVar5;
        iVar3 = iVar12;
        iVar12 = iVar3 + 1;
        uVar5 = uVar4 - 2;
        bVar1 = 0x103 < uVar10;
        uVar10 = uVar10 >> 2;
      } while (bVar1);
      iVar13 = 2 << ((byte)iVar12 & 0x1f);
      if (iVar3 + 0x21U < 2) {
        bVar8 = (char)uVar4 - 1;
        bVar11 = -(byte)iVar12;
        lVar23 = (uVar18 << ((byte)uVar5 & 0x3f)) + (lVar15 << (bVar11 & 0x3f));
        lVar14 = (uVar19 << ((byte)uVar5 & 0x3f)) + (lVar16 << (bVar11 & 0x3f));
        lVar20 = lVar20 << 0x20;
        lVar21 = lVar21 << 0x20;
        do {
          lVar20 = lVar20 + lVar23;
          lVar21 = lVar21 + lVar14;
          lVar23 = lVar23 + (uVar18 << (bVar8 & 0x3f));
          lVar14 = lVar14 + (uVar19 << (bVar8 & 0x3f));
          gray_render_line(worker,lVar20 >> 0x20,lVar21 >> 0x20);
          iVar13 = iVar13 + -1;
        } while (iVar13 != 0);
      }
      else {
        lVar23 = (uVar18 << (ulong)uVar5) + (lVar15 << (ulong)(uint)-iVar12);
        auVar2._4_8_ = 0;
        auVar2._0_4_ = (uint)lVar20;
        auVar22._0_12_ = auVar2 << 0x20;
        auVar22._12_4_ = (int)lVar21;
        do {
          lVar16 = uVar19 + lVar16;
          lVar21 = auVar22._0_8_ + lVar23;
          lVar14 = auVar22._8_8_ + lVar16;
          lVar23 = lVar23 + (uVar18 << (ulong)(uVar4 - 1));
          gray_render_line(worker,(long)(int)((ulong)lVar21 >> 0x20),
                           (long)(int)((ulong)lVar14 >> 0x20));
          auVar22._8_8_ = lVar14;
          auVar22._0_8_ = lVar21;
          iVar13 = iVar13 + -1;
        } while (iVar13 != 0);
      }
    }
  }
  else {
    worker->x = lVar14;
    worker->y = lVar23;
  }
  return 0;
}

Assistant:

static int
  gray_conic_to( const FT_Vector*  control,
                 const FT_Vector*  to,
                 gray_PWorker      worker )
  {
    gray_render_conic( RAS_VAR_ control, to );
    return 0;
  }